

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O3

void InsertInterval(CostManager *manager,CostInterval *interval_in,int64_t cost,int position,
                   int start,int end)

{
  int64_t *piVar1;
  CostInterval *pCVar2;
  CostInterval *pCVar3;
  long lVar4;
  CostInterval **ppCVar5;
  CostManager *pCVar6;
  int iVar7;
  CostInterval *pCVar8;
  
  if (end <= start) {
    return;
  }
  if (499 < manager->count) {
    piVar1 = manager->costs;
    lVar4 = (long)start;
    iVar7 = start - position;
    do {
      iVar7 = iVar7 + 1;
      if (cost < piVar1[lVar4]) {
        piVar1[lVar4] = cost;
        manager->dist_array[lVar4] = (uint16_t)iVar7;
      }
      lVar4 = lVar4 + 1;
    } while (end != lVar4);
    return;
  }
  pCVar3 = manager->free_intervals;
  if (pCVar3 == (CostInterval *)0x0) {
    pCVar3 = manager->recycled_intervals;
    if (pCVar3 == (CostInterval *)0x0) {
      pCVar3 = (CostInterval *)WebPSafeMalloc(1,0x28);
      if (pCVar3 == (CostInterval *)0x0) {
        piVar1 = manager->costs;
        lVar4 = (long)start;
        iVar7 = start - position;
        do {
          iVar7 = iVar7 + 1;
          if (cost < piVar1[lVar4]) {
            piVar1[lVar4] = cost;
            manager->dist_array[lVar4] = (uint16_t)iVar7;
          }
          lVar4 = lVar4 + 1;
        } while (end != lVar4);
        return;
      }
      goto LAB_0014b427;
    }
    ppCVar5 = &manager->recycled_intervals;
  }
  else {
    ppCVar5 = &manager->free_intervals;
  }
  *ppCVar5 = pCVar3->next;
LAB_0014b427:
  pCVar3->cost = cost;
  pCVar3->index = position;
  pCVar3->start = start;
  pCVar3->end = end;
  if (interval_in != (CostInterval *)0x0) goto LAB_0014b48b;
  for (interval_in = manager->head; interval_in != (CostInterval *)0x0;
      interval_in = interval_in->previous) {
LAB_0014b48b:
    if (interval_in->start <= start) goto LAB_0014b49a;
  }
  interval_in = (CostInterval *)0x0;
LAB_0014b49a:
  do {
    pCVar8 = interval_in;
    if (pCVar8 == (CostInterval *)0x0) {
      pCVar2 = manager->head;
      pCVar3->next = pCVar2;
      pCVar6 = manager;
      if (pCVar2 != (CostInterval *)0x0) {
        pCVar2->previous = pCVar3;
      }
      goto LAB_0014b4e3;
    }
    interval_in = pCVar8->next;
    if (interval_in == (CostInterval *)0x0) {
      pCVar3->next = (CostInterval *)0x0;
      pCVar6 = (CostManager *)&pCVar8->next;
      goto LAB_0014b4e3;
    }
    if (start <= interval_in->start) {
      pCVar3->next = interval_in;
      interval_in->previous = pCVar3;
      pCVar6 = (CostManager *)&pCVar8->next;
LAB_0014b4e3:
      pCVar6->head = pCVar3;
      pCVar3->previous = pCVar8;
      manager->count = manager->count + 1;
      return;
    }
  } while( true );
}

Assistant:

static WEBP_INLINE void InsertInterval(CostManager* const manager,
                                       CostInterval* const interval_in,
                                       int64_t cost, int position, int start,
                                       int end) {
  CostInterval* interval_new;

  if (start >= end) return;
  if (manager->count >= COST_CACHE_INTERVAL_SIZE_MAX) {
    // Serialize the interval if we cannot store it.
    UpdateCostPerInterval(manager, start, end, position, cost);
    return;
  }
  if (manager->free_intervals != NULL) {
    interval_new = manager->free_intervals;
    manager->free_intervals = interval_new->next;
  } else if (manager->recycled_intervals != NULL) {
    interval_new = manager->recycled_intervals;
    manager->recycled_intervals = interval_new->next;
  } else {  // malloc for good
    interval_new = (CostInterval*)WebPSafeMalloc(1, sizeof(*interval_new));
    if (interval_new == NULL) {
      // Write down the interval if we cannot create it.
      UpdateCostPerInterval(manager, start, end, position, cost);
      return;
    }
  }

  interval_new->cost = cost;
  interval_new->index = position;
  interval_new->start = start;
  interval_new->end = end;
  PositionOrphanInterval(manager, interval_new, interval_in);

  ++manager->count;
}